

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int INT_EVdfg_assign_node(EVdfg_stone stone,char *node_name)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  char *in_RSI;
  long *in_RDI;
  EVdfg_config_action act;
  timespec ts;
  EVint_node_list n;
  int node;
  int i;
  EVmaster master;
  EVdfg dfg;
  int in_stack_000000b4;
  EVdfg_configuration in_stack_000000b8;
  undefined1 in_stack_000000d0 [32];
  CMTraceType in_stack_ffffffffffffffac;
  CManager in_stack_ffffffffffffffb0;
  timespec local_48;
  long *local_38;
  uint local_30;
  uint local_2c;
  long *local_28;
  long local_20;
  char *local_18;
  int local_4;
  
  local_20 = *in_RDI;
  local_28 = *(long **)(local_20 + 8);
  local_30 = 0xffffffff;
  local_18 = in_RSI;
  for (local_2c = 0; (int)local_2c < *(int *)((long)local_28 + 0x34); local_2c = local_2c + 1) {
    local_38 = (long *)(local_28[7] + (long)(int)local_2c * 0x38);
    if ((local_38[1] == 0) || (iVar1 = strcmp((char *)local_38[1],local_18), iVar1 != 0)) {
      if ((*local_38 != 0) && (iVar1 = strcmp((char *)*local_38,local_18), iVar1 == 0)) {
        local_30 = local_2c;
      }
    }
    else {
      local_30 = local_2c;
    }
  }
  if (local_30 == 0xffffffff) {
    printf("Node \"%s\" not found in node list\n",local_18);
    local_4 = 0;
  }
  else {
    if (*(int *)(local_20 + 0x20) == 1) {
      iVar1 = CMtrace_val[0xd];
      if (*(long *)(*local_28 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          __stream = *(FILE **)(*local_28 + 0x120);
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf(*(FILE **)(*local_28 + 0x120),"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf(*(FILE **)(*local_28 + 0x120),"assign node, node# = %d\n",(ulong)local_30);
      }
      fflush(*(FILE **)(*local_28 + 0x120));
    }
    EVdfg_perform_act_on_state
              (in_stack_000000b8,(EVdfg_config_action)in_stack_000000d0,in_stack_000000b4);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

extern int
INT_EVdfg_assign_node(EVdfg_stone stone, char *node_name)
{
    EVdfg dfg = stone->dfg;
    EVmaster master = dfg->master;
    int i, node = -1;
    for (i = 0; i < master->node_count; i++) {
	EVint_node_list n = &master->nodes[i];
	if (n->canonical_name && (strcmp(n->canonical_name, node_name) == 0)) {
	    node = i;
	} else 	if (n->name && (strcmp(n->name, node_name) == 0)) {
	    node = i;
	}

    }
    if (node == -1) {
	printf("Node \"%s\" not found in node list\n", node_name);
	return 0;
    }
	
    if (dfg->realized == 1) {
	CMtrace_out(master->cm, EVdfgVerbose, "assign node, node# = %d\n", node);
    }
    EVdfg_config_action act;
    act.type = ACT_assign_node;
    act.stone_id = stone->stone_id;
    act.u.assign.dest_node = node;
    (void) EVdfg_perform_act_on_state(stone->dfg->working_state, act, 1 /* add to queue */);
    return 1;
}